

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O2

uint256 * SignatureHash<CTransaction>
                    (uint256 *__return_storage_ptr__,CScript *scriptCode,CTransaction *txTo,uint nIn
                    ,int nHashType,CAmount *amount,SigVersion sigversion,
                    PrecomputedTransactionData *cache)

{
  uint uVar1;
  long lVar2;
  uint uVar3;
  base_blob<256U> *pbVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  CScript *pCVar10;
  int iVar11;
  char cVar12;
  long lVar13;
  uint uVar14;
  uint32_t obj;
  char cVar15;
  CScript *data;
  long in_FS_OFFSET;
  HashWriter ss;
  uint256 local_c8;
  base_blob<256U> local_a8;
  uint256 hashSequence;
  uint256 hashPrevouts;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  uVar9 = (ulong)nIn;
  if ((ulong)(((long)(txTo->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                     super__Vector_impl_data._M_finish -
              (long)(txTo->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                    super__Vector_impl_data._M_start) / 0x68) <= uVar9) {
    __assert_fail("nIn < txTo.vin.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/interpreter.cpp"
                  ,0x622,
                  "uint256 SignatureHash(const CScript &, const T &, unsigned int, int, const CAmount &, SigVersion, const PrecomputedTransactionData *) [T = CTransaction]"
                 );
  }
  cVar15 = (char)nHashType;
  if (sigversion == WITNESS_V0) {
    hashPrevouts.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
    hashPrevouts.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
    hashPrevouts.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
    hashPrevouts.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
    hashPrevouts.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
    hashPrevouts.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
    hashPrevouts.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
    hashPrevouts.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
    hashPrevouts.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
    hashPrevouts.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
    hashPrevouts.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
    hashPrevouts.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
    hashPrevouts.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
    hashPrevouts.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
    hashPrevouts.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
    hashPrevouts.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
    hashPrevouts.super_base_blob<256U>.m_data._M_elems[0] = '\0';
    hashPrevouts.super_base_blob<256U>.m_data._M_elems[1] = '\0';
    hashPrevouts.super_base_blob<256U>.m_data._M_elems[2] = '\0';
    hashPrevouts.super_base_blob<256U>.m_data._M_elems[3] = '\0';
    hashPrevouts.super_base_blob<256U>.m_data._M_elems[4] = '\0';
    hashPrevouts.super_base_blob<256U>.m_data._M_elems[5] = '\0';
    hashPrevouts.super_base_blob<256U>.m_data._M_elems[6] = '\0';
    hashPrevouts.super_base_blob<256U>.m_data._M_elems[7] = '\0';
    hashPrevouts.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    hashPrevouts.super_base_blob<256U>.m_data._M_elems[9] = '\0';
    hashPrevouts.super_base_blob<256U>.m_data._M_elems[10] = '\0';
    hashPrevouts.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
    hashPrevouts.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
    hashPrevouts.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
    hashPrevouts.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
    hashPrevouts.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
    hashSequence.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
    hashSequence.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
    hashSequence.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
    hashSequence.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
    hashSequence.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
    hashSequence.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
    hashSequence.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
    hashSequence.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
    hashSequence.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
    hashSequence.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
    hashSequence.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
    hashSequence.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
    hashSequence.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
    hashSequence.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
    hashSequence.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
    hashSequence.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
    hashSequence.super_base_blob<256U>.m_data._M_elems[0] = '\0';
    hashSequence.super_base_blob<256U>.m_data._M_elems[1] = '\0';
    hashSequence.super_base_blob<256U>.m_data._M_elems[2] = '\0';
    hashSequence.super_base_blob<256U>.m_data._M_elems[3] = '\0';
    hashSequence.super_base_blob<256U>.m_data._M_elems[4] = '\0';
    hashSequence.super_base_blob<256U>.m_data._M_elems[5] = '\0';
    hashSequence.super_base_blob<256U>.m_data._M_elems[6] = '\0';
    hashSequence.super_base_blob<256U>.m_data._M_elems[7] = '\0';
    hashSequence.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    hashSequence.super_base_blob<256U>.m_data._M_elems[9] = '\0';
    hashSequence.super_base_blob<256U>.m_data._M_elems[10] = '\0';
    hashSequence.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
    hashSequence.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
    hashSequence.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
    hashSequence.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
    hashSequence.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
    local_a8.m_data._M_elems._16_8_ = 0;
    local_a8.m_data._M_elems._24_8_ = 0;
    local_a8.m_data._M_elems._0_8_ = 0;
    local_a8.m_data._M_elems._8_8_ = 0;
    if (cache == (PrecomputedTransactionData *)0x0) {
      if (-1 < cVar15) {
LAB_00397b32:
        anon_unknown.dwarf_12198ed::GetPrevoutsSHA256<CTransaction>(&local_c8,txTo);
        SHA256Uint256((uint256 *)&ss,&local_c8);
        cVar12 = '\0';
        goto LAB_00397b63;
      }
      if ((nHashType & 0x1eU) == 2) goto LAB_00397eeb;
LAB_00397f87:
      anon_unknown.dwarf_12198ed::GetOutputsSHA256<CTransaction>(&local_c8,txTo);
      SHA256Uint256((uint256 *)&ss,&local_c8);
LAB_00397fa7:
      local_a8.m_data._M_elems._16_8_ = ss.ctx.s._16_8_;
      local_a8.m_data._M_elems._24_8_ = ss.ctx.s._24_8_;
      local_a8.m_data._M_elems._0_8_ = ss.ctx.s._0_8_;
      local_a8.m_data._M_elems._8_8_ = ss.ctx.s._8_8_;
    }
    else {
      cVar12 = cache->m_bip143_segwit_ready;
      if (cVar15 < '\0') {
LAB_00397ee5:
        if ((nHashType & 0x1eU) != 2) {
          if (cVar12 == '\0') goto LAB_00397f87;
          ss.ctx.s._0_8_ = *(undefined8 *)(cache->hashOutputs).super_base_blob<256U>.m_data._M_elems
          ;
          ss.ctx.s._8_8_ =
               *(undefined8 *)((cache->hashOutputs).super_base_blob<256U>.m_data._M_elems + 8);
          ss.ctx.s._16_8_ =
               *(undefined8 *)((cache->hashOutputs).super_base_blob<256U>.m_data._M_elems + 0x10);
          ss.ctx.s._24_8_ =
               *(undefined8 *)((cache->hashOutputs).super_base_blob<256U>.m_data._M_elems + 0x18);
          goto LAB_00397fa7;
        }
      }
      else {
        if ((bool)cVar12 == false) goto LAB_00397b32;
        ss.ctx.s._0_8_ = *(undefined8 *)(cache->hashPrevouts).super_base_blob<256U>.m_data._M_elems;
        ss.ctx.s._8_8_ =
             *(undefined8 *)((cache->hashPrevouts).super_base_blob<256U>.m_data._M_elems + 8);
        ss.ctx.s._16_8_ =
             *(undefined8 *)((cache->hashPrevouts).super_base_blob<256U>.m_data._M_elems + 0x10);
        ss.ctx.s._24_8_ =
             *(undefined8 *)((cache->hashPrevouts).super_base_blob<256U>.m_data._M_elems + 0x18);
        cVar12 = '\x01';
LAB_00397b63:
        hashPrevouts.super_base_blob<256U>.m_data._M_elems._16_8_ = ss.ctx.s._16_8_;
        hashPrevouts.super_base_blob<256U>.m_data._M_elems._24_8_ = ss.ctx.s._24_8_;
        hashPrevouts.super_base_blob<256U>.m_data._M_elems._0_8_ = ss.ctx.s._0_8_;
        hashPrevouts.super_base_blob<256U>.m_data._M_elems._8_8_ = ss.ctx.s._8_8_;
        if ((nHashType & 0x1eU) != 2) {
          if (cVar12 == '\0') {
            anon_unknown.dwarf_12198ed::GetSequencesSHA256<CTransaction>(&local_c8,txTo);
            SHA256Uint256((uint256 *)&ss,&local_c8);
          }
          else {
            ss.ctx.s._0_8_ =
                 *(undefined8 *)(cache->hashSequence).super_base_blob<256U>.m_data._M_elems;
            ss.ctx.s._8_8_ =
                 *(undefined8 *)((cache->hashSequence).super_base_blob<256U>.m_data._M_elems + 8);
            ss.ctx.s._16_8_ =
                 *(undefined8 *)((cache->hashSequence).super_base_blob<256U>.m_data._M_elems + 0x10)
            ;
            ss.ctx.s._24_8_ =
                 *(undefined8 *)((cache->hashSequence).super_base_blob<256U>.m_data._M_elems + 0x18)
            ;
          }
          hashSequence.super_base_blob<256U>.m_data._M_elems._16_8_ = ss.ctx.s._16_8_;
          hashSequence.super_base_blob<256U>.m_data._M_elems._24_8_ = ss.ctx.s._24_8_;
          hashSequence.super_base_blob<256U>.m_data._M_elems._0_8_ = ss.ctx.s._0_8_;
          hashSequence.super_base_blob<256U>.m_data._M_elems._8_8_ = ss.ctx.s._8_8_;
          goto LAB_00397ee5;
        }
      }
LAB_00397eeb:
      if (((nHashType & 0x1fU) == 3) &&
         (uVar9 < (ulong)(((long)(txTo->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                          (long)(txTo->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                                _M_impl.super__Vector_impl_data._M_start) / 0x28))) {
        ss.ctx.buf[0x30] = '\0';
        ss.ctx.buf[0x31] = '\0';
        ss.ctx.buf[0x32] = '\0';
        ss.ctx.buf[0x33] = '\0';
        ss.ctx.buf[0x34] = '\0';
        ss.ctx.buf[0x35] = '\0';
        ss.ctx.buf[0x36] = '\0';
        ss.ctx.buf[0x37] = '\0';
        ss.ctx.buf[0x38] = '\0';
        ss.ctx.buf[0x39] = '\0';
        ss.ctx.buf[0x3a] = '\0';
        ss.ctx.buf[0x3b] = '\0';
        ss.ctx.buf[0x3c] = '\0';
        ss.ctx.buf[0x3d] = '\0';
        ss.ctx.buf[0x3e] = '\0';
        ss.ctx.buf[0x3f] = '\0';
        ss.ctx.buf[0x20] = '\0';
        ss.ctx.buf[0x21] = '\0';
        ss.ctx.buf[0x22] = '\0';
        ss.ctx.buf[0x23] = '\0';
        ss.ctx.buf[0x24] = '\0';
        ss.ctx.buf[0x25] = '\0';
        ss.ctx.buf[0x26] = '\0';
        ss.ctx.buf[0x27] = '\0';
        ss.ctx.buf[0x28] = '\0';
        ss.ctx.buf[0x29] = '\0';
        ss.ctx.buf[0x2a] = '\0';
        ss.ctx.buf[0x2b] = '\0';
        ss.ctx.buf[0x2c] = '\0';
        ss.ctx.buf[0x2d] = '\0';
        ss.ctx.buf[0x2e] = '\0';
        ss.ctx.buf[0x2f] = '\0';
        ss.ctx.buf[0x10] = '\0';
        ss.ctx.buf[0x11] = '\0';
        ss.ctx.buf[0x12] = '\0';
        ss.ctx.buf[0x13] = '\0';
        ss.ctx.buf[0x14] = '\0';
        ss.ctx.buf[0x15] = '\0';
        ss.ctx.buf[0x16] = '\0';
        ss.ctx.buf[0x17] = '\0';
        ss.ctx.buf[0x18] = '\0';
        ss.ctx.buf[0x19] = '\0';
        ss.ctx.buf[0x1a] = '\0';
        ss.ctx.buf[0x1b] = '\0';
        ss.ctx.buf[0x1c] = '\0';
        ss.ctx.buf[0x1d] = '\0';
        ss.ctx.buf[0x1e] = '\0';
        ss.ctx.buf[0x1f] = '\0';
        ss.ctx.buf[0] = '\0';
        ss.ctx.buf[1] = '\0';
        ss.ctx.buf[2] = '\0';
        ss.ctx.buf[3] = '\0';
        ss.ctx.buf[4] = '\0';
        ss.ctx.buf[5] = '\0';
        ss.ctx.buf[6] = '\0';
        ss.ctx.buf[7] = '\0';
        ss.ctx.buf[8] = '\0';
        ss.ctx.buf[9] = '\0';
        ss.ctx.buf[10] = '\0';
        ss.ctx.buf[0xb] = '\0';
        ss.ctx.buf[0xc] = '\0';
        ss.ctx.buf[0xd] = '\0';
        ss.ctx.buf[0xe] = '\0';
        ss.ctx.buf[0xf] = '\0';
        ss.ctx.s[4] = 0;
        ss.ctx.s[5] = 0;
        ss.ctx.s[6] = 0;
        ss.ctx.s[7] = 0;
        ss.ctx.s[0] = 0;
        ss.ctx.s[1] = 0;
        ss.ctx.s[2] = 0;
        ss.ctx.s[3] = 0;
        ss.ctx.bytes = 0;
        CSHA256::CSHA256(&ss.ctx);
        CTxOut::SerializationOps<HashWriter,CTxOut_const,ActionSerialize>
                  ((txTo->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                   super__Vector_impl_data._M_start + uVar9,&ss.ctx);
        HashWriter::GetHash((uint256 *)&local_a8,(HashWriter *)&ss.ctx);
      }
    }
    ss.ctx.buf[0x30] = '\0';
    ss.ctx.buf[0x31] = '\0';
    ss.ctx.buf[0x32] = '\0';
    ss.ctx.buf[0x33] = '\0';
    ss.ctx.buf[0x34] = '\0';
    ss.ctx.buf[0x35] = '\0';
    ss.ctx.buf[0x36] = '\0';
    ss.ctx.buf[0x37] = '\0';
    ss.ctx.buf[0x38] = '\0';
    ss.ctx.buf[0x39] = '\0';
    ss.ctx.buf[0x3a] = '\0';
    ss.ctx.buf[0x3b] = '\0';
    ss.ctx.buf[0x3c] = '\0';
    ss.ctx.buf[0x3d] = '\0';
    ss.ctx.buf[0x3e] = '\0';
    ss.ctx.buf[0x3f] = '\0';
    ss.ctx.buf[0x20] = '\0';
    ss.ctx.buf[0x21] = '\0';
    ss.ctx.buf[0x22] = '\0';
    ss.ctx.buf[0x23] = '\0';
    ss.ctx.buf[0x24] = '\0';
    ss.ctx.buf[0x25] = '\0';
    ss.ctx.buf[0x26] = '\0';
    ss.ctx.buf[0x27] = '\0';
    ss.ctx.buf[0x28] = '\0';
    ss.ctx.buf[0x29] = '\0';
    ss.ctx.buf[0x2a] = '\0';
    ss.ctx.buf[0x2b] = '\0';
    ss.ctx.buf[0x2c] = '\0';
    ss.ctx.buf[0x2d] = '\0';
    ss.ctx.buf[0x2e] = '\0';
    ss.ctx.buf[0x2f] = '\0';
    ss.ctx.buf[0x10] = '\0';
    ss.ctx.buf[0x11] = '\0';
    ss.ctx.buf[0x12] = '\0';
    ss.ctx.buf[0x13] = '\0';
    ss.ctx.buf[0x14] = '\0';
    ss.ctx.buf[0x15] = '\0';
    ss.ctx.buf[0x16] = '\0';
    ss.ctx.buf[0x17] = '\0';
    ss.ctx.buf[0x18] = '\0';
    ss.ctx.buf[0x19] = '\0';
    ss.ctx.buf[0x1a] = '\0';
    ss.ctx.buf[0x1b] = '\0';
    ss.ctx.buf[0x1c] = '\0';
    ss.ctx.buf[0x1d] = '\0';
    ss.ctx.buf[0x1e] = '\0';
    ss.ctx.buf[0x1f] = '\0';
    ss.ctx.buf[0] = '\0';
    ss.ctx.buf[1] = '\0';
    ss.ctx.buf[2] = '\0';
    ss.ctx.buf[3] = '\0';
    ss.ctx.buf[4] = '\0';
    ss.ctx.buf[5] = '\0';
    ss.ctx.buf[6] = '\0';
    ss.ctx.buf[7] = '\0';
    ss.ctx.buf[8] = '\0';
    ss.ctx.buf[9] = '\0';
    ss.ctx.buf[10] = '\0';
    ss.ctx.buf[0xb] = '\0';
    ss.ctx.buf[0xc] = '\0';
    ss.ctx.buf[0xd] = '\0';
    ss.ctx.buf[0xe] = '\0';
    ss.ctx.buf[0xf] = '\0';
    ss.ctx.s[4] = 0;
    ss.ctx.s[5] = 0;
    ss.ctx.s[6] = 0;
    ss.ctx.s[7] = 0;
    ss.ctx.s[0] = 0;
    ss.ctx.s[1] = 0;
    ss.ctx.s[2] = 0;
    ss.ctx.s[3] = 0;
    ss.ctx.bytes = 0;
    CSHA256::CSHA256(&ss.ctx);
    HashWriter::operator<<((HashWriter *)&ss.ctx,&txTo->version);
    base_blob<256U>::Serialize<HashWriter>
              (&hashPrevouts.super_base_blob<256U>,(HashWriter *)&ss.ctx);
    base_blob<256U>::Serialize<HashWriter>
              (&hashSequence.super_base_blob<256U>,(HashWriter *)&ss.ctx);
    COutPoint::SerializationOps<HashWriter,COutPoint_const,ActionSerialize>
              ((txTo->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_start + uVar9,&ss.ctx);
    Serialize<HashWriter,28u,unsigned_char>((HashWriter *)&ss.ctx,&scriptCode->super_CScriptBase);
    HashWriter::operator<<((HashWriter *)&ss.ctx,amount);
    HashWriter::operator<<
              ((HashWriter *)&ss.ctx,
               &(txTo->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_start[uVar9].nSequence);
    base_blob<256U>::Serialize<HashWriter>(&local_a8,(HashWriter *)&ss.ctx);
    HashWriter::operator<<((HashWriter *)&ss.ctx,&txTo->nLockTime);
    ser_writedata32<HashWriter>((HashWriter *)&ss.ctx,nHashType);
  }
  else {
    uVar6 = nHashType & 0x1f;
    if ((uVar6 == 3) &&
       ((ulong)(((long)(txTo->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                (long)(txTo->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                      super__Vector_impl_data._M_start) / 0x28) <= uVar9)) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
        pbVar4 = &__return_storage_ptr__->super_base_blob<256U>;
        (pbVar4->m_data)._M_elems[0x10] = '\0';
        (pbVar4->m_data)._M_elems[0x11] = '\0';
        (pbVar4->m_data)._M_elems[0x12] = '\0';
        (pbVar4->m_data)._M_elems[0x13] = '\0';
        (pbVar4->m_data)._M_elems[0x14] = '\0';
        (pbVar4->m_data)._M_elems[0x15] = '\0';
        (pbVar4->m_data)._M_elems[0x16] = '\0';
        (pbVar4->m_data)._M_elems[0x17] = '\0';
        pbVar4 = &__return_storage_ptr__->super_base_blob<256U>;
        (pbVar4->m_data)._M_elems[0x18] = '\0';
        (pbVar4->m_data)._M_elems[0x19] = '\0';
        (pbVar4->m_data)._M_elems[0x1a] = '\0';
        (pbVar4->m_data)._M_elems[0x1b] = '\0';
        (pbVar4->m_data)._M_elems[0x1c] = '\0';
        (pbVar4->m_data)._M_elems[0x1d] = '\0';
        (pbVar4->m_data)._M_elems[0x1e] = '\0';
        (pbVar4->m_data)._M_elems[0x1f] = '\0';
        (__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems[0] = '\x01';
        (__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems[1] = '\0';
        (__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems[2] = '\0';
        (__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems[3] = '\0';
        (__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems[4] = '\0';
        (__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems[5] = '\0';
        (__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems[6] = '\0';
        (__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems[7] = '\0';
        pbVar4 = &__return_storage_ptr__->super_base_blob<256U>;
        (pbVar4->m_data)._M_elems[8] = '\0';
        (pbVar4->m_data)._M_elems[9] = '\0';
        (pbVar4->m_data)._M_elems[10] = '\0';
        (pbVar4->m_data)._M_elems[0xb] = '\0';
        (pbVar4->m_data)._M_elems[0xc] = '\0';
        (pbVar4->m_data)._M_elems[0xd] = '\0';
        (pbVar4->m_data)._M_elems[0xe] = '\0';
        (pbVar4->m_data)._M_elems[0xf] = '\0';
        return __return_storage_ptr__;
      }
      goto LAB_0039811a;
    }
    ss.ctx.buf[0x30] = '\0';
    ss.ctx.buf[0x31] = '\0';
    ss.ctx.buf[0x32] = '\0';
    ss.ctx.buf[0x33] = '\0';
    ss.ctx.buf[0x34] = '\0';
    ss.ctx.buf[0x35] = '\0';
    ss.ctx.buf[0x36] = '\0';
    ss.ctx.buf[0x37] = '\0';
    ss.ctx.buf[0x38] = '\0';
    ss.ctx.buf[0x39] = '\0';
    ss.ctx.buf[0x3a] = '\0';
    ss.ctx.buf[0x3b] = '\0';
    ss.ctx.buf[0x3c] = '\0';
    ss.ctx.buf[0x3d] = '\0';
    ss.ctx.buf[0x3e] = '\0';
    ss.ctx.buf[0x3f] = '\0';
    ss.ctx.buf[0x20] = '\0';
    ss.ctx.buf[0x21] = '\0';
    ss.ctx.buf[0x22] = '\0';
    ss.ctx.buf[0x23] = '\0';
    ss.ctx.buf[0x24] = '\0';
    ss.ctx.buf[0x25] = '\0';
    ss.ctx.buf[0x26] = '\0';
    ss.ctx.buf[0x27] = '\0';
    ss.ctx.buf[0x28] = '\0';
    ss.ctx.buf[0x29] = '\0';
    ss.ctx.buf[0x2a] = '\0';
    ss.ctx.buf[0x2b] = '\0';
    ss.ctx.buf[0x2c] = '\0';
    ss.ctx.buf[0x2d] = '\0';
    ss.ctx.buf[0x2e] = '\0';
    ss.ctx.buf[0x2f] = '\0';
    ss.ctx.buf[0x10] = '\0';
    ss.ctx.buf[0x11] = '\0';
    ss.ctx.buf[0x12] = '\0';
    ss.ctx.buf[0x13] = '\0';
    ss.ctx.buf[0x14] = '\0';
    ss.ctx.buf[0x15] = '\0';
    ss.ctx.buf[0x16] = '\0';
    ss.ctx.buf[0x17] = '\0';
    ss.ctx.buf[0x18] = '\0';
    ss.ctx.buf[0x19] = '\0';
    ss.ctx.buf[0x1a] = '\0';
    ss.ctx.buf[0x1b] = '\0';
    ss.ctx.buf[0x1c] = '\0';
    ss.ctx.buf[0x1d] = '\0';
    ss.ctx.buf[0x1e] = '\0';
    ss.ctx.buf[0x1f] = '\0';
    ss.ctx.buf[0] = '\0';
    ss.ctx.buf[1] = '\0';
    ss.ctx.buf[2] = '\0';
    ss.ctx.buf[3] = '\0';
    ss.ctx.buf[4] = '\0';
    ss.ctx.buf[5] = '\0';
    ss.ctx.buf[6] = '\0';
    ss.ctx.buf[7] = '\0';
    ss.ctx.buf[8] = '\0';
    ss.ctx.buf[9] = '\0';
    ss.ctx.buf[10] = '\0';
    ss.ctx.buf[0xb] = '\0';
    ss.ctx.buf[0xc] = '\0';
    ss.ctx.buf[0xd] = '\0';
    ss.ctx.buf[0xe] = '\0';
    ss.ctx.buf[0xf] = '\0';
    ss.ctx.s[4] = 0;
    ss.ctx.s[5] = 0;
    ss.ctx.s[6] = 0;
    ss.ctx.s[7] = 0;
    ss.ctx.s[0] = 0;
    ss.ctx.s[1] = 0;
    ss.ctx.s[2] = 0;
    ss.ctx.s[3] = 0;
    ss.ctx.bytes = 0;
    CSHA256::CSHA256(&ss.ctx);
    ser_writedata32<HashWriter>((HashWriter *)&ss.ctx,txTo->version);
    if (cVar15 < '\0') {
      uVar8 = 1;
    }
    else {
      uVar8 = ((long)(txTo->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                     super__Vector_impl_data._M_finish -
              (long)(txTo->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                    super__Vector_impl_data._M_start) / 0x68;
    }
    WriteCompactSize<HashWriter>(&ss,uVar8 & 0xffffffff);
    for (uVar7 = 0; uVar7 != (uint)uVar8; uVar7 = uVar7 + 1) {
      uVar3 = nIn;
      if (-1 < cVar15) {
        uVar3 = uVar7;
      }
      COutPoint::SerializationOps<HashWriter,COutPoint_const,ActionSerialize>
                ((txTo->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                 super__Vector_impl_data._M_start + uVar3,&ss);
      if (uVar3 == nIn) {
        data = scriptCode;
        if (0x1c < (scriptCode->super_CScriptBase)._size) {
          data = *(CScript **)&(scriptCode->super_CScriptBase)._union;
        }
        iVar11 = 0;
        hashPrevouts.super_base_blob<256U>.m_data._M_elems._0_8_ = data;
        while (bVar5 = CScript::GetOp(scriptCode,(const_iterator *)&hashPrevouts,
                                      (opcodetype *)&hashSequence), bVar5) {
          iVar11 = iVar11 + (uint)(hashSequence.super_base_blob<256U>.m_data._M_elems._0_4_ == 0xab)
          ;
        }
        uVar1 = (scriptCode->super_CScriptBase)._size;
        uVar14 = uVar1 - 0x1d;
        if (uVar1 < 0x1d) {
          uVar14 = uVar1;
        }
        WriteCompactSize<HashWriter>((HashWriter *)&ss.ctx,(ulong)(uVar14 - iVar11));
        hashPrevouts.super_base_blob<256U>.m_data._M_elems._0_8_ = data;
        while( true ) {
          bVar5 = CScript::GetOp(scriptCode,(const_iterator *)&hashPrevouts,
                                 (opcodetype *)&hashSequence);
          if (!bVar5) break;
          if (hashSequence.super_base_blob<256U>.m_data._M_elems._0_4_ == 0xab) {
            CSHA256::Write(&ss.ctx,(uchar *)data,
                           (long)(int)(~(uint)data +
                                      hashPrevouts.super_base_blob<256U>.m_data._M_elems._0_4_));
            data = (CScript *)hashPrevouts.super_base_blob<256U>.m_data._M_elems._0_8_;
          }
        }
        uVar1 = (scriptCode->super_CScriptBase)._size;
        uVar14 = uVar1 - 0x1d;
        if (uVar1 < 0x1d) {
          uVar14 = uVar1;
        }
        pCVar10 = (CScript *)(scriptCode->super_CScriptBase)._union.indirect_contents.indirect;
        if (uVar1 < 0x1d) {
          pCVar10 = scriptCode;
        }
        if (data != (CScript *)((pCVar10->super_CScriptBase)._union.direct + (int)uVar14)) {
          CSHA256::Write(&ss.ctx,(uchar *)data,
                         (long)(int)(hashPrevouts.super_base_blob<256U>.m_data._M_elems._0_4_ -
                                    (uint)data));
        }
LAB_00397d4b:
        obj = (txTo->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_start[uVar3].nSequence;
      }
      else {
        hashPrevouts.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
        hashPrevouts.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
        hashPrevouts.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
        hashPrevouts.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
        hashPrevouts.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
        hashPrevouts.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
        hashPrevouts.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
        hashPrevouts.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
        hashPrevouts.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
        hashPrevouts.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
        hashPrevouts.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
        hashPrevouts.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
        hashPrevouts.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
        hashPrevouts.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
        hashPrevouts.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
        hashPrevouts.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
        hashPrevouts.super_base_blob<256U>.m_data._M_elems[0] = '\0';
        hashPrevouts.super_base_blob<256U>.m_data._M_elems[1] = '\0';
        hashPrevouts.super_base_blob<256U>.m_data._M_elems[2] = '\0';
        hashPrevouts.super_base_blob<256U>.m_data._M_elems[3] = '\0';
        hashPrevouts.super_base_blob<256U>.m_data._M_elems[4] = '\0';
        hashPrevouts.super_base_blob<256U>.m_data._M_elems[5] = '\0';
        hashPrevouts.super_base_blob<256U>.m_data._M_elems[6] = '\0';
        hashPrevouts.super_base_blob<256U>.m_data._M_elems[7] = '\0';
        hashPrevouts.super_base_blob<256U>.m_data._M_elems[8] = '\0';
        hashPrevouts.super_base_blob<256U>.m_data._M_elems[9] = '\0';
        hashPrevouts.super_base_blob<256U>.m_data._M_elems[10] = '\0';
        hashPrevouts.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
        hashPrevouts.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
        hashPrevouts.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
        hashPrevouts.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
        hashPrevouts.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
        Serialize<HashWriter,28u,unsigned_char>
                  (&ss,(prevector<28U,_unsigned_char,_unsigned_int,_int> *)&hashPrevouts);
        prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
                  ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&hashPrevouts);
        obj = 0;
        if ((nHashType & 0x1eU) != 2) goto LAB_00397d4b;
      }
      ser_writedata32<HashWriter>(&ss,obj);
    }
    uVar7 = 0;
    if (uVar6 != 2) {
      if (uVar6 == 3) {
        uVar7 = nIn + 1;
      }
      else {
        uVar7 = (uint)(((long)(txTo->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)(txTo->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                             _M_impl.super__Vector_impl_data._M_start) / 0x28);
      }
    }
    WriteCompactSize<HashWriter>(&ss,(ulong)uVar7);
    for (lVar13 = 0; (ulong)uVar7 * 0x28 - lVar13 != 0; lVar13 = lVar13 + 0x28) {
      if ((uVar6 == 3) && (uVar9 * 0x28 - lVar13 != 0)) {
        CTxOut::CTxOut((CTxOut *)&hashPrevouts);
        CTxOut::SerializationOps<HashWriter,CTxOut_const,ActionSerialize>
                  ((CTxOut *)&hashPrevouts,&ss);
        prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
                  ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                   (hashPrevouts.super_base_blob<256U>.m_data._M_elems + 8));
      }
      else {
        CTxOut::SerializationOps<HashWriter,CTxOut_const,ActionSerialize>
                  ((long)&((txTo->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                           super__Vector_impl_data._M_start)->nValue + lVar13,&ss);
      }
    }
    ser_writedata32<HashWriter>(&ss,txTo->nLockTime);
    ser_writedata32<HashWriter>(&ss,nHashType);
  }
  HashWriter::GetHash(__return_storage_ptr__,&ss);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return __return_storage_ptr__;
  }
LAB_0039811a:
  __stack_chk_fail();
}

Assistant:

uint256 SignatureHash(const CScript& scriptCode, const T& txTo, unsigned int nIn, int nHashType, const CAmount& amount, SigVersion sigversion, const PrecomputedTransactionData* cache)
{
    assert(nIn < txTo.vin.size());

    if (sigversion == SigVersion::WITNESS_V0) {
        uint256 hashPrevouts;
        uint256 hashSequence;
        uint256 hashOutputs;
        const bool cacheready = cache && cache->m_bip143_segwit_ready;

        if (!(nHashType & SIGHASH_ANYONECANPAY)) {
            hashPrevouts = cacheready ? cache->hashPrevouts : SHA256Uint256(GetPrevoutsSHA256(txTo));
        }

        if (!(nHashType & SIGHASH_ANYONECANPAY) && (nHashType & 0x1f) != SIGHASH_SINGLE && (nHashType & 0x1f) != SIGHASH_NONE) {
            hashSequence = cacheready ? cache->hashSequence : SHA256Uint256(GetSequencesSHA256(txTo));
        }


        if ((nHashType & 0x1f) != SIGHASH_SINGLE && (nHashType & 0x1f) != SIGHASH_NONE) {
            hashOutputs = cacheready ? cache->hashOutputs : SHA256Uint256(GetOutputsSHA256(txTo));
        } else if ((nHashType & 0x1f) == SIGHASH_SINGLE && nIn < txTo.vout.size()) {
            HashWriter ss{};
            ss << txTo.vout[nIn];
            hashOutputs = ss.GetHash();
        }

        HashWriter ss{};
        // Version
        ss << txTo.version;
        // Input prevouts/nSequence (none/all, depending on flags)
        ss << hashPrevouts;
        ss << hashSequence;
        // The input being signed (replacing the scriptSig with scriptCode + amount)
        // The prevout may already be contained in hashPrevout, and the nSequence
        // may already be contain in hashSequence.
        ss << txTo.vin[nIn].prevout;
        ss << scriptCode;
        ss << amount;
        ss << txTo.vin[nIn].nSequence;
        // Outputs (none/one/all, depending on flags)
        ss << hashOutputs;
        // Locktime
        ss << txTo.nLockTime;
        // Sighash type
        ss << nHashType;

        return ss.GetHash();
    }

    // Check for invalid use of SIGHASH_SINGLE
    if ((nHashType & 0x1f) == SIGHASH_SINGLE) {
        if (nIn >= txTo.vout.size()) {
            //  nOut out of range
            return uint256::ONE;
        }
    }

    // Wrapper to serialize only the necessary parts of the transaction being signed
    CTransactionSignatureSerializer<T> txTmp(txTo, scriptCode, nIn, nHashType);

    // Serialize and hash
    HashWriter ss{};
    ss << txTmp << nHashType;
    return ss.GetHash();
}